

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O3

void __thiscall ncnn::Yolov3Detection::Yolov3Detection(Yolov3Detection *this)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  ParamDict local_910;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3Detection_00193d50;
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
  (this->biases).allocator = (Allocator *)0x0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).c = 0;
  (this->biases).cstep = 0;
  pLVar3 = create_layer(0x20);
  this->softmax = pLVar3;
  ParamDict::ParamDict(&local_910);
  ParamDict::set(&local_910,0,0);
  (*this->softmax->_vptr_Layer[2])(this->softmax,&local_910);
  pLVar3 = create_layer(0x1e);
  this->sigmoid = pLVar3;
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&local_910.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_910.params[0].type + lVar4);
        plVar2 = *(long **)((long)&local_910.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_910.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_910.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return;
}

Assistant:

Yolov3Detection::Yolov3Detection()
{
    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
    ncnn::ParamDict pd;
    pd.set(0, 0);
    softmax->load_param(pd);

    sigmoid = ncnn::create_layer(ncnn::LayerType::Sigmoid);
}